

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::OpenPopupEx(ImGuiID id)

{
  ImVec2 *mouse_pos;
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ImVec2 IVar5;
  ImGuiPopupData *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiPopupData *pIVar9;
  long lVar10;
  int iVar11;
  ImVec2 *pIVar12;
  int iVar13;
  int iVar14;
  ImVec2 local_50;
  int local_44;
  ImGuiWindow *local_40;
  ImVec2 local_38;
  
  pIVar7 = GImGui;
  iVar2 = (GImGui->BeginPopupStack).Size;
  local_50.x = 0.0;
  local_50.y = 0.0;
  lVar10 = (long)(GImGui->CurrentWindow->IDStack).Size;
  if (0 < lVar10) {
    local_40 = GImGui->NavWindow;
    iVar14 = GImGui->FrameCount;
    uVar3 = (GImGui->CurrentWindow->IDStack).Data[lVar10 + -1];
    local_50 = NavCalcPreferredRefPos();
    mouse_pos = &(pIVar7->IO).MousePos;
    bVar8 = IsMousePosValid(mouse_pos);
    pIVar12 = &local_50;
    if (bVar8) {
      pIVar12 = mouse_pos;
    }
    IVar5 = *pIVar12;
    iVar4 = (pIVar7->OpenPopupStack).Size;
    if (iVar2 < iVar4) {
      pIVar6 = (pIVar7->OpenPopupStack).Data;
      if ((pIVar6[iVar2].PopupId == id) && (pIVar6[iVar2].OpenFrameCount == pIVar7->FrameCount + -1)
         ) {
        pIVar6[iVar2].OpenFrameCount = iVar14;
      }
      else {
        iVar13 = iVar2 + 1;
        iVar4 = (pIVar7->OpenPopupStack).Capacity;
        local_38 = IVar5;
        local_44 = iVar14;
        if (iVar4 <= iVar2) {
          if (iVar4 == 0) {
            iVar14 = 8;
          }
          else {
            iVar14 = iVar4 / 2 + iVar4;
          }
          if (iVar14 <= iVar13) {
            iVar14 = iVar13;
          }
          if (iVar4 < iVar14) {
            if (GImGui != (ImGuiContext *)0x0) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + 1;
            }
            pIVar9 = (ImGuiPopupData *)
                     (*GImAllocatorAllocFunc)((long)iVar14 * 0x30,GImAllocatorUserData);
            pIVar6 = (pIVar7->OpenPopupStack).Data;
            if (pIVar6 != (ImGuiPopupData *)0x0) {
              memcpy(pIVar9,pIVar6,(long)(pIVar7->OpenPopupStack).Size * 0x30);
              pIVar6 = (pIVar7->OpenPopupStack).Data;
              if ((pIVar6 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar1 = *piVar1 + -1;
              }
              (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
            }
            (pIVar7->OpenPopupStack).Data = pIVar9;
            (pIVar7->OpenPopupStack).Capacity = iVar14;
          }
        }
        (pIVar7->OpenPopupStack).Size = iVar13;
        pIVar6 = (pIVar7->OpenPopupStack).Data;
        pIVar6[iVar2].PopupId = id;
        pIVar6[iVar2].Window = (ImGuiWindow *)0x0;
        pIVar6[iVar2].SourceWindow = local_40;
        pIVar6[iVar2].OpenFrameCount = local_44;
        pIVar6[iVar2].OpenParentId = uVar3;
        pIVar6[iVar2].OpenPopupPos = local_50;
        pIVar6[iVar2].OpenMousePos = local_38;
      }
    }
    else {
      iVar2 = (pIVar7->OpenPopupStack).Capacity;
      if (iVar4 == iVar2) {
        if (iVar2 == 0) {
          iVar13 = 8;
        }
        else {
          iVar13 = iVar2 / 2 + iVar2;
        }
        iVar11 = iVar4 + 1;
        if (iVar4 + 1 < iVar13) {
          iVar11 = iVar13;
        }
        if (iVar2 < iVar11) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          pIVar9 = (ImGuiPopupData *)
                   (*GImAllocatorAllocFunc)((long)iVar11 * 0x30,GImAllocatorUserData);
          pIVar6 = (pIVar7->OpenPopupStack).Data;
          if (pIVar6 != (ImGuiPopupData *)0x0) {
            memcpy(pIVar9,pIVar6,(long)(pIVar7->OpenPopupStack).Size * 0x30);
            pIVar6 = (pIVar7->OpenPopupStack).Data;
            if ((pIVar6 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
          }
          (pIVar7->OpenPopupStack).Data = pIVar9;
          (pIVar7->OpenPopupStack).Capacity = iVar11;
        }
      }
      pIVar6 = (pIVar7->OpenPopupStack).Data;
      iVar2 = (pIVar7->OpenPopupStack).Size;
      pIVar6[iVar2].PopupId = id;
      pIVar6[iVar2].Window = (ImGuiWindow *)0x0;
      pIVar6[iVar2].SourceWindow = local_40;
      pIVar6[iVar2].OpenFrameCount = iVar14;
      pIVar6[iVar2].OpenParentId = uVar3;
      pIVar6[iVar2].OpenPopupPos = local_50;
      pIVar6[iVar2].OpenMousePos = IVar5;
      (pIVar7->OpenPopupStack).Size = (pIVar7->OpenPopupStack).Size + 1;
    }
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                ,0x538,"T &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.BeginPopupStack.Size;
    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    //IMGUI_DEBUG_LOG("OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            g.OpenPopupStack.resize(current_stack_size + 1);
            g.OpenPopupStack[current_stack_size] = popup_ref;
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}